

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

CURLcode Curl_resolv_check(Curl_easy *data,Curl_dns_entry **dns)

{
  dnsprobe *datap;
  dynbuf *s;
  byte bVar1;
  DNStype DVar2;
  int iVar3;
  dohdata *pdVar4;
  sockaddr *psVar5;
  undefined8 uVar6;
  ushort uVar7;
  ushort rdlength;
  DOHcode DVar8;
  uchar *puVar9;
  size_t sVar10;
  char *pcVar11;
  size_t sVar12;
  Curl_addrinfo *pCVar13;
  Curl_dns_entry *pCVar14;
  sa_family_t sVar15;
  char *pcVar16;
  uint uVar17;
  dohentry *pdVar18;
  ushort type;
  CURLcode CVar19;
  long lVar20;
  DOHcode *pDVar21;
  anon_union_16_2_f9ece763_for_ip *paVar22;
  uint uVar23;
  long lVar24;
  size_t sVar25;
  bool bVar26;
  int iVar27;
  ulong uVar28;
  Curl_addrinfo *pCVar29;
  bool bVar30;
  Curl_addrinfo *pCStack_370;
  DOHcode DStack_348;
  DOHcode DStack_344;
  dohdata *pdStack_340;
  Curl_easy *pCStack_338;
  Curl_dns_entry **ppCStack_330;
  uint auStack_328 [2];
  char acStack_31e [126];
  dohentry dStack_2a0;
  
  if (((data->conn->bits).field_0x7 & 8) == 0) {
    return CURLE_COULDNT_RESOLVE_HOST;
  }
  pdVar4 = (data->req).doh;
  *dns = (Curl_dns_entry *)0x0;
  if (pdVar4 == (dohdata *)0x0) {
    CVar19 = CURLE_OUT_OF_MEMORY;
  }
  else if ((pdVar4->probe[0].easy == (CURL_conflict *)0x0) &&
          (pdVar4->probe[1].easy == (CURL_conflict *)0x0)) {
    Curl_failf(data,"Could not DoH-resolve: %s",(data->state).async.hostname);
    CVar19 = (((data->conn->bits).field_0x4 & 0x20) == 0) + CURLE_COULDNT_RESOLVE_PROXY;
  }
  else {
    CVar19 = CURLE_OK;
    if (pdVar4->pending == 0) {
      datap = pdVar4->probe;
      lVar24 = 0;
      DStack_348 = DOH_OK;
      DStack_344 = DOH_OK;
      ppCStack_330 = dns;
      curl_multi_remove_handle(data->multi,pdVar4->probe[0].easy);
      Curl_close(&datap->easy);
      pdStack_340 = pdVar4;
      curl_multi_remove_handle(data->multi,pdVar4->probe[1].easy);
      Curl_close(&pdVar4->probe[1].easy);
      memset(&dStack_2a0,0,0x270);
      dStack_2a0.ttl = 0x7fffffff;
      do {
        Curl_dyn_init((dynbuf *)((long)&dStack_2a0.cname[0].bufr + lVar24),0x100);
        lVar24 = lVar24 + 0x20;
      } while (lVar24 != 0x80);
      pDVar21 = &DStack_348;
      lVar24 = 0;
      bVar26 = true;
      pCStack_338 = data;
LAB_005d2790:
      if (pdVar4->probe[lVar24].dnstype != 0) {
        s = &datap[lVar24].serverdoh;
        puVar9 = Curl_dyn_uptr(s);
        sVar10 = Curl_dyn_len(s);
        DVar8 = DOH_TOO_SMALL_BUFFER;
        if ((((0xb < sVar10) && (DVar8 = DOH_DNS_BAD_ID, puVar9 != (uchar *)0x0)) &&
            (*puVar9 == '\0')) &&
           ((puVar9[1] == '\0' && (DVar8 = DOH_DNS_BAD_RCODE, (puVar9[3] & 0xf) == 0)))) {
          DVar2 = datap[lVar24].dnstype;
          sVar25 = 0xc;
          for (uVar7 = *(ushort *)(puVar9 + 4) << 8 | *(ushort *)(puVar9 + 4) >> 8; uVar7 != 0;
              uVar7 = uVar7 - 1) {
            do {
              uVar23 = (int)sVar25 + 1;
              if (sVar10 < uVar23) goto LAB_005d2b22;
              bVar1 = puVar9[sVar25];
              if ((bVar1 & 0xc0) != 0) {
                DVar8 = DOH_DNS_BAD_LABEL;
                if ((bVar1 & 0xc0) != 0xc0) goto LAB_005d2b27;
                uVar23 = (int)sVar25 + 2;
                if (sVar10 < uVar23) goto LAB_005d2b22;
                break;
              }
              uVar23 = uVar23 + bVar1;
              sVar25 = (size_t)uVar23;
              if (sVar10 < sVar25) goto LAB_005d2b22;
            } while (bVar1 != 0);
            sVar25 = (size_t)(uVar23 + 4);
            DVar8 = DOH_DNS_OUT_OF_RANGE;
            if (sVar10 < sVar25) goto LAB_005d2b27;
          }
          uVar7 = *(ushort *)(puVar9 + 6) << 8 | *(ushort *)(puVar9 + 6) >> 8;
          if (uVar7 == 0) {
            bVar30 = true;
          }
          else {
LAB_005d289f:
            do {
              uVar23 = (int)sVar25 + 1;
              if (sVar10 < uVar23) goto LAB_005d2b22;
              bVar1 = puVar9[sVar25];
              if ((bVar1 & 0xc0) == 0) {
                uVar23 = uVar23 + bVar1;
                if (sVar10 < uVar23) goto LAB_005d2b22;
                sVar25 = (size_t)uVar23;
                if (bVar1 != 0) goto LAB_005d289f;
              }
              else {
                DVar8 = DOH_DNS_BAD_LABEL;
                if ((bVar1 & 0xc0) != 0xc0) goto LAB_005d2b27;
                uVar23 = (int)sVar25 + 2;
                if (sVar10 < uVar23) goto LAB_005d2b22;
              }
              if (sVar10 < uVar23 + 2) goto LAB_005d2b22;
              type = *(ushort *)(puVar9 + (int)uVar23) << 8 | *(ushort *)(puVar9 + (int)uVar23) >> 8
              ;
              if (((type != 5) && (type != DNS_TYPE_DNAME)) && (DVar2 != type)) {
                DVar8 = DOH_DNS_UNEXPECTED_TYPE;
                goto LAB_005d2b27;
              }
              if (sVar10 < uVar23 + 4) goto LAB_005d2b22;
              if ((ushort)(*(ushort *)(puVar9 + (int)(uVar23 + 2)) << 8 |
                          *(ushort *)(puVar9 + (int)(uVar23 + 2)) >> 8) != 1) {
                DVar8 = DOH_DNS_UNEXPECTED_CLASS;
                goto LAB_005d2b27;
              }
              if (sVar10 < uVar23 + 8) goto LAB_005d2b22;
              uVar17 = *(uint *)(puVar9 + (int)(uVar23 + 4));
              uVar17 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                       uVar17 << 0x18;
              if (uVar17 < dStack_2a0.ttl) {
                dStack_2a0.ttl = uVar17;
              }
              uVar17 = uVar23 + 10;
              if (sVar10 < uVar17) goto LAB_005d2b22;
              rdlength = *(ushort *)(puVar9 + (int)(uVar23 + 8)) << 8 |
                         *(ushort *)(puVar9 + (int)(uVar23 + 8)) >> 8;
              sVar25 = (size_t)(uVar17 + rdlength);
              DVar8 = DOH_DNS_OUT_OF_RANGE;
              if (sVar10 < sVar25) goto LAB_005d2b27;
              DVar8 = rdata(puVar9,sVar10,rdlength,type,uVar17,&dStack_2a0);
              if (DVar8 != DOH_OK) {
                *pDVar21 = DVar8;
                Curl_dyn_free(s);
                pcVar11 = "bad error code";
                if (DVar8 < (DOH_DNS_BAD_ID|DOH_DNS_OUT_OF_RANGE)) goto LAB_005d2b33;
                goto LAB_005d2b43;
              }
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
            bVar30 = type != 2;
          }
          auStack_328[0] = (uint)sVar25;
          uVar23 = auStack_328[0];
          for (uVar7 = *(ushort *)(puVar9 + 8) << 8 | *(ushort *)(puVar9 + 8) >> 8; uVar7 != 0;
              uVar7 = uVar7 - 1) {
            do {
              uVar23 = (int)sVar25 + 1;
              if (sVar10 < uVar23) goto LAB_005d2b22;
              bVar1 = puVar9[sVar25];
              if ((bVar1 & 0xc0) != 0) {
                DVar8 = DOH_DNS_BAD_LABEL;
                if ((bVar1 & 0xc0) != 0xc0) goto LAB_005d2b27;
                uVar23 = (int)sVar25 + 2;
                if (sVar10 < uVar23) goto LAB_005d2b22;
                break;
              }
              uVar23 = uVar23 + bVar1;
              if (sVar10 < uVar23) goto LAB_005d2b22;
              sVar25 = (size_t)uVar23;
            } while (bVar1 != 0);
            if ((sVar10 < uVar23 + 8) || (sVar10 < uVar23 + 10)) goto LAB_005d2b22;
            uVar23 = (uint)(ushort)(*(ushort *)(puVar9 + (int)(uVar23 + 8)) << 8 |
                                   *(ushort *)(puVar9 + (int)(uVar23 + 8)) >> 8) + uVar23 + 10;
            sVar25 = (size_t)uVar23;
            DVar8 = DOH_DNS_OUT_OF_RANGE;
            if (sVar10 < sVar25) goto LAB_005d2b27;
          }
          auStack_328[0] = uVar23;
          for (uVar7 = *(ushort *)(puVar9 + 10) << 8 | *(ushort *)(puVar9 + 10) >> 8; uVar7 != 0;
              uVar7 = uVar7 - 1) {
            DVar8 = skipqname(puVar9,sVar10,auStack_328);
            if (DVar8 != DOH_OK) goto LAB_005d2b27;
            DVar8 = DOH_DNS_OUT_OF_RANGE;
            if ((sVar10 < auStack_328[0] + 8) || (sVar10 < auStack_328[0] + 10)) goto LAB_005d2b27;
            uVar23 = (uint)(ushort)(*(ushort *)(puVar9 + (int)(auStack_328[0] + 8)) << 8 |
                                   *(ushort *)(puVar9 + (int)(auStack_328[0] + 8)) >> 8) +
                     auStack_328[0] + 10;
            sVar25 = (size_t)uVar23;
            if (sVar10 < sVar25) goto LAB_005d2b27;
            auStack_328[0] = uVar23;
          }
          DVar8 = DOH_DNS_MALFORMAT;
          if ((sVar10 == sVar25) &&
             ((!(bool)(bVar30 & dStack_2a0.numcname == 0) ||
              (DVar8 = DOH_NO_CONTENT, dStack_2a0.numaddr != 0)))) {
            *pDVar21 = DOH_OK;
            Curl_dyn_free(s);
            data = pCStack_338;
            goto LAB_005d2b82;
          }
        }
        goto LAB_005d2b27;
      }
      goto LAB_005d2b82;
    }
  }
  return CVar19;
LAB_005d2b22:
  DVar8 = DOH_DNS_OUT_OF_RANGE;
LAB_005d2b27:
  *pDVar21 = DVar8;
  Curl_dyn_free(s);
LAB_005d2b33:
  pcVar11 = errors_rel + *(int *)(errors_rel + (ulong)DVar8 * 4);
LAB_005d2b43:
  data = pCStack_338;
  pcVar16 = "AAAA";
  if (datap[lVar24].dnstype == DNS_TYPE_A) {
    pcVar16 = "A";
  }
  Curl_infof(pCStack_338,"DoH: %s type %s for %s",pcVar11,pcVar16,pdStack_340->host);
LAB_005d2b82:
  lVar24 = 1;
  pDVar21 = &DStack_344;
  bVar30 = !bVar26;
  bVar26 = false;
  if (bVar30) goto LAB_005d2c3b;
  goto LAB_005d2790;
LAB_005d2c3b:
  CVar19 = CURLE_COULDNT_RESOLVE_HOST;
  if ((DStack_348 == DOH_OK) || (DStack_344 == DOH_OK)) {
    Curl_infof(data,"DoH Host name: %s",pdStack_340->host);
    Curl_infof(data,"TTL: %u seconds",(ulong)dStack_2a0.ttl);
    if (0 < dStack_2a0.numaddr) {
      puVar9 = dStack_2a0.addr[0].ip.v4 + 1;
      lVar24 = 0;
      do {
        iVar3 = dStack_2a0.addr[lVar24].type;
        if (iVar3 == 0x1c) {
          curl_msnprintf((char *)auStack_328,0x80,"DoH AAAA: ");
          sVar10 = 0x76;
          uVar28 = 0xfffffffffffffffe;
          pcVar11 = acStack_31e;
          do {
            pcVar16 = "    :";
            if (uVar28 == 0xfffffffffffffffe) {
              pcVar16 = "PK\x01\x02";
            }
            curl_msnprintf(pcVar11,sVar10,"%s%02x%02x",pcVar16 + 4,(ulong)puVar9[uVar28 + 1],
                           (ulong)puVar9[uVar28 + 2]);
            sVar12 = strlen(pcVar11);
            data = pCStack_338;
            sVar10 = sVar10 - sVar12;
            pcVar11 = pcVar11 + sVar12;
            uVar28 = uVar28 + 2;
          } while (uVar28 < 0xe);
          Curl_infof(pCStack_338,"%s",auStack_328);
        }
        else if (iVar3 == 1) {
          Curl_infof(data,"DoH A: %u.%u.%u.%u",(ulong)dStack_2a0.addr[lVar24].ip.v4[0],
                     (ulong)dStack_2a0.addr[lVar24].ip.v4[1],(ulong)dStack_2a0.addr[lVar24].ip.v4[2]
                     ,(ulong)dStack_2a0.addr[lVar24].ip.v4[3]);
        }
        lVar24 = lVar24 + 1;
        puVar9 = puVar9 + 0x14;
      } while (lVar24 < dStack_2a0.numaddr);
    }
    if (0 < dStack_2a0.numcname) {
      pdVar18 = &dStack_2a0;
      lVar24 = 0;
      do {
        pcVar11 = Curl_dyn_ptr(pdVar18->cname);
        Curl_infof(data,"CNAME: %s",pcVar11);
        lVar24 = lVar24 + 1;
        pdVar18 = (dohentry *)(pdVar18->cname + 1);
      } while (lVar24 < dStack_2a0.numcname);
    }
    iVar27 = dStack_2a0.numcname;
    iVar3 = dStack_2a0.numaddr;
    pdVar4 = pdStack_340;
    pcVar11 = pdStack_340->host;
    sVar12 = strlen(pcVar11);
    if (iVar3 < 1) {
LAB_005d305f:
      if (iVar27 < 1) {
        return CURLE_OUT_OF_MEMORY;
      }
      lVar24 = 0;
      pdVar18 = &dStack_2a0;
      do {
        Curl_dyn_free(pdVar18->cname);
        lVar24 = lVar24 + 1;
        pdVar18 = (dohentry *)(pdVar18->cname + 1);
      } while (lVar24 < dStack_2a0.numcname);
      return CURLE_OUT_OF_MEMORY;
    }
    uVar7 = (ushort)pdVar4->port;
    paVar22 = &dStack_2a0.addr[0].ip;
    lVar24 = 0;
    pCStack_370 = (Curl_addrinfo *)0x0;
    pCVar29 = (Curl_addrinfo *)0x0;
    do {
      iVar3 = ((dohaddr *)((long)paVar22 + -4))->type;
      lVar20 = 0x1c;
      if (iVar3 != 0x1c) {
        lVar20 = 0x10;
      }
      pCVar13 = (Curl_addrinfo *)(*Curl_ccalloc)(1,sVar12 + 0x31 + lVar20);
      if (pCVar13 == (Curl_addrinfo *)0x0) {
        Curl_freeaddrinfo(pCStack_370);
        iVar27 = dStack_2a0.numcname;
        goto LAB_005d305f;
      }
      pCVar13->ai_addr = (sockaddr *)(pCVar13 + 1);
      pcVar16 = (char *)((long)&pCVar13[1].ai_flags + lVar20);
      pCVar13->ai_canonname = pcVar16;
      memcpy(pcVar16,pcVar11,sVar12 + 1);
      data = pCStack_338;
      if (pCStack_370 == (Curl_addrinfo *)0x0) {
        pCStack_370 = pCVar13;
      }
      if (pCVar29 != (Curl_addrinfo *)0x0) {
        pCVar29->ai_next = pCVar13;
      }
      pCVar13->ai_family = (uint)(iVar3 == 0x1c) * 8 + 2;
      pCVar13->ai_socktype = 1;
      pCVar13->ai_addrlen = (curl_socklen_t)lVar20;
      psVar5 = pCVar13->ai_addr;
      if (iVar3 == 0x1c) {
        uVar6 = *(undefined8 *)((long)paVar22 + 8);
        *(undefined8 *)(psVar5->sa_data + 6) = *(undefined8 *)paVar22;
        psVar5[1].sa_family = (short)uVar6;
        psVar5[1].sa_data[0] = (char)((ulong)uVar6 >> 0x10);
        psVar5[1].sa_data[1] = (char)((ulong)uVar6 >> 0x18);
        psVar5[1].sa_data[2] = (char)((ulong)uVar6 >> 0x20);
        psVar5[1].sa_data[3] = (char)((ulong)uVar6 >> 0x28);
        psVar5[1].sa_data[4] = (char)((ulong)uVar6 >> 0x30);
        psVar5[1].sa_data[5] = (char)((ulong)uVar6 >> 0x38);
        sVar15 = 10;
      }
      else {
        *(undefined4 *)(psVar5->sa_data + 2) = *(undefined4 *)paVar22;
        sVar15 = 2;
      }
      psVar5->sa_family = sVar15;
      *(ushort *)psVar5->sa_data = uVar7 << 8 | uVar7 >> 8;
      lVar24 = lVar24 + 1;
      paVar22 = (anon_union_16_2_f9ece763_for_ip *)((long)paVar22 + 0x14);
      pCVar29 = pCVar13;
    } while (lVar24 < dStack_2a0.numaddr);
    if (pCStack_338->share != (Curl_share *)0x0) {
      Curl_share_lock(pCStack_338,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
    }
    pCVar14 = Curl_cache_addr(data,pCStack_370,pdStack_340->host,pdStack_340->port);
    CVar19 = CURLE_COULDNT_RESOLVE_HOST;
    if (data->share != (Curl_share *)0x0) {
      Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
    }
    if (pCVar14 == (Curl_dns_entry *)0x0) {
      Curl_freeaddrinfo(pCStack_370);
    }
    else {
      (data->state).async.dns = pCVar14;
      *ppCStack_330 = pCVar14;
      CVar19 = CURLE_OK;
    }
  }
  if (0 < dStack_2a0.numcname) {
    pdVar18 = &dStack_2a0;
    lVar24 = 0;
    do {
      Curl_dyn_free(pdVar18->cname);
      lVar24 = lVar24 + 1;
      pdVar18 = (dohentry *)(pdVar18->cname + 1);
    } while (lVar24 < dStack_2a0.numcname);
  }
  (*Curl_cfree)((data->req).doh);
  (data->req).doh = (dohdata *)0x0;
  return CVar19;
}

Assistant:

CURLcode Curl_resolv_check(struct Curl_easy *data,
                           struct Curl_dns_entry **dns)
{
#if defined(CURL_DISABLE_DOH) && !defined(CURLRES_ASYNCH)
  (void)data;
  (void)dns;
#endif
#ifndef CURL_DISABLE_DOH
  if(data->conn->bits.doh)
    return Curl_doh_is_resolved(data, dns);
#endif
  return Curl_resolver_is_resolved(data, dns);
}